

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O1

double mfb_timer_delta(mfb_timer *tmr)

{
  uint64_t uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  if (tmr != (mfb_timer *)0x0) {
    uVar1 = mfb_timer_tick();
    lVar2 = uVar1 - tmr->delta_counter;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    tmr->delta_counter = uVar1;
    return ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * g_timer_resolution;
  }
  return 0.0;
}

Assistant:

double
mfb_timer_delta(struct mfb_timer *tmr) {
    int64_t     counter;
    uint64_t    delta;

    if(tmr == 0x0) 
        return 0.0;

    counter            = mfb_timer_tick();
    delta              = (counter - tmr->delta_counter);
    tmr->delta_counter = counter;

    return delta * g_timer_resolution;
}